

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall fasttext::Matrix::addRow(Matrix *this,Vector *vec,int64_t i,real a)

{
  undefined1 auVar1 [16];
  long lVar2;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint in_XMM0_Da;
  int64_t j;
  long local_28;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                  ,0x47,"void fasttext::Matrix::addRow(const Vector &, int64_t, real)");
  }
  if (in_RDX < in_RDI[1]) {
    if (*in_RSI == in_RDI[2]) {
      for (local_28 = 0; local_28 < in_RDI[2]; local_28 = local_28 + 1) {
        lVar2 = in_RDX * in_RDI[2] + local_28;
        auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RSI[1] + local_28 * 4)),ZEXT416(in_XMM0_Da),
                                 ZEXT416(*(uint *)(*in_RDI + lVar2 * 4)));
        *(int *)(*in_RDI + lVar2 * 4) = auVar1._0_4_;
      }
      return;
    }
    __assert_fail("vec.m_ == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                  ,0x49,"void fasttext::Matrix::addRow(const Vector &, int64_t, real)");
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/matrix.cc"
                ,0x48,"void fasttext::Matrix::addRow(const Vector &, int64_t, real)");
}

Assistant:

void Matrix::addRow(const Vector& vec, int64_t i, real a) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.m_ == n_);
  for (int64_t j = 0; j < n_; j++) {
    data_[i * n_ + j] += a * vec.data_[j];
  }
  /*std::ofstream ofs("matrix.txt", std::ios_base::app);
  for (int64_t i = 0; i < 20; i++) {
    ofs << data_[i] << " ";
  }
  ofs << std::endl;*/
}